

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_isExtensible(JSContext *ctx,JSValue obj)

{
  JSValue val;
  JSValue v;
  JSValue this_obj;
  JSValue func_obj;
  int iVar1;
  int iVar2;
  JSValueUnion ctx_00;
  JSValue *in_RDX;
  undefined8 in_RSI;
  JSContext *in_RDI;
  bool bVar3;
  JSValue JVar4;
  JSValueUnion unaff_retaddr;
  int64_t in_stack_00000008;
  int res2;
  BOOL res;
  JSValue ret;
  JSValue method;
  JSProxyData *s;
  JSContext *in_stack_ffffffffffffff88;
  JSValue in_stack_ffffffffffffff90;
  JSValueUnion local_58;
  undefined4 uVar5;
  int in_stack_ffffffffffffffbc;
  undefined4 uVar6;
  JSContext *in_stack_ffffffffffffffc0;
  JSValueUnion in_stack_ffffffffffffffc8;
  int64_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  JVar4.tag = in_stack_00000008;
  JVar4.u.ptr = unaff_retaddr.ptr;
  ctx_00.ptr = get_proxy_method((JSContext *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDX
                                ,JVar4,(JSAtom)((ulong)in_RSI >> 0x20));
  if (ctx_00.ptr == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    v.tag = in_stack_ffffffffffffffd0;
    v.u.ptr = in_stack_ffffffffffffffc8.ptr;
    iVar1 = JS_IsUndefined(v);
    if (iVar1 == 0) {
      func_obj.tag = (int64_t)in_RDI;
      func_obj.u.ptr = ctx_00.ptr;
      this_obj.tag = in_stack_ffffffffffffffd0;
      this_obj.u.ptr = in_stack_ffffffffffffffc8.ptr;
      JVar4 = JS_CallFree(in_stack_ffffffffffffffc0,func_obj,this_obj,in_stack_ffffffffffffffbc,
                          (JSValue *)unaff_retaddr.ptr);
      uVar5 = JVar4.u._0_4_;
      uVar6 = JVar4.u._4_4_;
      local_58 = (JSValueUnion)JVar4.tag;
      iVar1 = JS_IsException(JVar4);
      if (iVar1 == 0) {
        val.tag = (int64_t)in_stack_ffffffffffffffc8.ptr;
        val.u.float64 = local_58.float64;
        iVar2 = JS_ToBoolFree((JSContext *)CONCAT44(uVar6,uVar5),val);
        iVar1 = JS_IsExtensible((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff90);
        if ((-1 < iVar1) && (bVar3 = iVar2 != iVar1, iVar1 = iVar2, bVar3)) {
          JS_ThrowTypeError(in_RDI,"proxy: inconsistent isExtensible");
          iVar1 = -1;
        }
      }
      else {
        iVar1 = -1;
      }
    }
    else {
      iVar1 = JS_IsExtensible(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    }
  }
  return iVar1;
}

Assistant:

static int js_proxy_isExtensible(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret;
    BOOL res;
    int res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_isExtensible);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_IsExtensible(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    res2 = JS_IsExtensible(ctx, s->target);
    if (res2 < 0)
        return res2;
    if (res != res2) {
        JS_ThrowTypeError(ctx, "proxy: inconsistent isExtensible");
        return -1;
    }
    return res;
}